

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

Vector3d * __thiscall OpenMD::Thermo::getHeatFlux(Vector3d *__return_storage_ptr__,Thermo *this)

{
  Snapshot *this_00;
  Molecule *pMVar1;
  double *pdVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  StuntDouble *this_01;
  pointer ppSVar8;
  double dVar9;
  RealType RVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Vector3d heatFluxJc;
  Vector3d angMom;
  Vector3d vel;
  MoleculeIterator miter;
  Mat3x3d I;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector3d x_a;
  Vector3d heatFluxJv;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  miter._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&vel.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&angMom.super_Vector<double,_3U>);
  SquareMatrix<double,_3>::SquareMatrix(&I.super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&x_a.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector
            (&heatFluxJc.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  pMVar1 = SimInfo::beginMolecule(this->info_,&miter);
  do {
    if (pMVar1 == (Molecule *)0x0) {
      Snapshot::getConductiveHeatFlux((Vector3d *)&local_c0,this_00);
      operator*(&local_a8,&local_c0,0.0004184);
      Vector<double,_3U>::Vector(&heatFluxJv.super_Vector<double,_3U>,&local_a8);
      OpenMD::operator+(&local_c0,&heatFluxJv.super_Vector<double,_3U>,
                        &heatFluxJc.super_Vector<double,_3U>);
      RVar10 = getVolume(this);
      operator/(&local_a8,&local_c0,RVar10);
      Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>,&local_a8);
      return __return_storage_ptr__;
    }
    ppSVar8 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar8 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0015b49e;
    this_01 = (StuntDouble *)0x0;
    while (this_01 != (StuntDouble *)0x0) {
      RVar10 = this_01->mass_;
      StuntDouble::getVel(&heatFluxJv,this_01);
      Vector<double,_3U>::operator=(&vel.super_Vector<double,_3U>,(Vector<double,_3U> *)&heatFluxJv)
      ;
      dVar11 = (vel.super_Vector<double,_3U>.data_[2] * vel.super_Vector<double,_3U>.data_[2] +
               vel.super_Vector<double,_3U>.data_[0] * vel.super_Vector<double,_3U>.data_[0] +
               vel.super_Vector<double,_3U>.data_[1] * vel.super_Vector<double,_3U>.data_[1]) *
               RVar10;
      if (this_01->objType_ - otDAtom < 2) {
        StuntDouble::getJ(&heatFluxJv,this_01);
        Vector<double,_3U>::operator=
                  (&angMom.super_Vector<double,_3U>,(Vector<double,_3U> *)&heatFluxJv);
        (*this_01->_vptr_StuntDouble[5])((RectMatrix<double,_3U,_3U> *)&heatFluxJv,this_01);
        RectMatrix<double,_3U,_3U>::operator=
                  ((RectMatrix<double,_3U,_3U> *)&I,(RectMatrix<double,_3U,_3U> *)&heatFluxJv);
        if (this_01->linear_ == true) {
          uVar7 = (long)(this_01->linearAxis_ + 1) % 3 & 0xffffffff;
          uVar5 = (long)(this_01->linearAxis_ + 2) % 3 & 0xffffffff;
          dVar12 = angMom.super_Vector<double,_3U>.data_[uVar7];
          dVar9 = (dVar12 * dVar12) /
                  *(double *)
                   ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                   uVar7 * 0x20);
          dVar12 = angMom.super_Vector<double,_3U>.data_[uVar5];
          dVar12 = dVar12 * dVar12;
          pdVar2 = (double *)
                   ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                   uVar5 * 0x20);
        }
        else {
          auVar13._0_8_ =
               angMom.super_Vector<double,_3U>.data_[0] * angMom.super_Vector<double,_3U>.data_[0];
          auVar13._8_8_ =
               angMom.super_Vector<double,_3U>.data_[1] * angMom.super_Vector<double,_3U>.data_[1];
          auVar14._8_8_ =
               I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
          auVar14._0_8_ =
               I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
          auVar14 = divpd(auVar13,auVar14);
          dVar9 = auVar14._8_8_ + auVar14._0_8_;
          dVar12 = angMom.super_Vector<double,_3U>.data_[2] *
                   angMom.super_Vector<double,_3U>.data_[2];
          pdVar2 = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2] + 2;
        }
        dVar11 = dVar11 + dVar12 / *pdVar2 + dVar9;
        if (this_01->objType_ != otRigidBody) goto LAB_0015b422;
        lVar3 = __dynamic_cast(this_01,&StuntDouble::typeinfo,&RigidBody::typeinfo,0,in_R8,in_R9,
                               dVar11);
        plVar4 = *(long **)(lVar3 + 0x128);
        dVar12 = 0.0;
        while( true ) {
          lVar6 = 0;
          if (plVar4 != *(long **)(lVar3 + 0x130)) {
            lVar6 = *plVar4;
          }
          if (lVar6 == 0) break;
          dVar12 = dVar12 + *(double *)
                             (*(long *)(*(long *)(*(long *)(lVar6 + 0x18) + 0x18) + 0x90 +
                                       *(long *)(lVar6 + 0x10)) + (long)*(int *)(lVar6 + 0x30) * 8);
          plVar4 = plVar4 + 1;
        }
      }
      else {
LAB_0015b422:
        dVar12 = *(double *)
                  (*(long *)((long)&(this_01->snapshotMan_->currentSnapshot_->atomData).particlePot.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + this_01->storage_) +
                  (long)this_01->localIndex_ * 8);
      }
      dVar11 = (dVar12 * 0.0004184 + dVar11) * 0.5;
      heatFluxJc.super_Vector<double,_3U>.data_[0] =
           dVar11 * vel.super_Vector<double,_3U>.data_[0] +
           heatFluxJc.super_Vector<double,_3U>.data_[0];
      heatFluxJc.super_Vector<double,_3U>.data_[1] =
           dVar11 * vel.super_Vector<double,_3U>.data_[1] +
           heatFluxJc.super_Vector<double,_3U>.data_[1];
      heatFluxJc.super_Vector<double,_3U>.data_[2] =
           dVar11 * vel.super_Vector<double,_3U>.data_[2] +
           heatFluxJc.super_Vector<double,_3U>.data_[2];
      ppSVar8 = ppSVar8 + 1;
      this_01 = (StuntDouble *)0x0;
      if (ppSVar8 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0015b49e:
        this_01 = *ppSVar8;
      }
    }
    pMVar1 = SimInfo::nextMolecule(this->info_,&miter);
  } while( true );
}

Assistant:

Vector3d Thermo::getHeatFlux() {
    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    SimInfo::MoleculeIterator miter;
    vector<StuntDouble*>::iterator iiter;
    Molecule* mol;
    StuntDouble* sd;
    RigidBody::AtomIterator ai;
    Atom* atom;
    Vector3d vel;
    Vector3d angMom;
    Mat3x3d I;
    int i;
    int j;
    int k;
    RealType mass;

    Vector3d x_a;
    RealType kinetic;
    RealType potential;
    RealType eatom;
    // Convective portion of the heat flux
    Vector3d heatFluxJc = V3Zero;

    /* Calculate convective portion of the heat flux */
    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        mass = sd->getMass();
        vel  = sd->getVel();

        kinetic = mass * (vel[0] * vel[0] + vel[1] * vel[1] + vel[2] * vel[2]);

        if (sd->isDirectional()) {
          angMom = sd->getJ();
          I      = sd->getI();

          if (sd->isLinear()) {
            i = sd->linearAxis();
            j = (i + 1) % 3;
            k = (i + 2) % 3;
            kinetic += angMom[j] * angMom[j] / I(j, j) +
                       angMom[k] * angMom[k] / I(k, k);
          } else {
            kinetic += angMom[0] * angMom[0] / I(0, 0) +
                       angMom[1] * angMom[1] / I(1, 1) +
                       angMom[2] * angMom[2] / I(2, 2);
          }
        }

        potential = 0.0;

        if (sd->isRigidBody()) {
          RigidBody* rb = dynamic_cast<RigidBody*>(sd);
          for (atom = rb->beginAtom(ai); atom != NULL;
               atom = rb->nextAtom(ai)) {
            potential += atom->getParticlePot();
          }
        } else {
          potential = sd->getParticlePot();
        }

        potential *= Constants::energyConvert;  // amu A^2/fs^2
        // The potential may not be a 1/2 factor
        eatom = (kinetic + potential) / 2.0;  // amu A^2/fs^2
        heatFluxJc[0] += eatom * vel[0];      // amu A^3/fs^3
        heatFluxJc[1] += eatom * vel[1];      // amu A^3/fs^3
        heatFluxJc[2] += eatom * vel[2];      // amu A^3/fs^3
      }
    }

    /* The J_v vector is reduced in the forceManager so everyone has
     *  the global Jv. Jc is computed over the local atoms and must be
     *  reduced among all processors.
     */
#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &heatFluxJc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // (kcal/mol * A/fs) * conversion => (amu A^3)/fs^3

    Vector3d heatFluxJv =
        currSnapshot->getConductiveHeatFlux() * Constants::energyConvert;

    // Correct for the fact the flux is 1/V (Jc + Jv)
    return (heatFluxJv + heatFluxJc) / this->getVolume();  // amu / fs^3
  }